

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  ~ResponseImpl(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}